

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeDeleteAuxData(sqlite3 *db,AuxData **pp,int iOp,int mask)

{
  uint in_ECX;
  int in_EDX;
  sqlite3_mutex **in_RSI;
  AuxData *pAux;
  void *in_stack_ffffffffffffffd8;
  sqlite3 *db_00;
  sqlite3_mutex **local_10;
  
  local_10 = in_RSI;
  while (*local_10 != (sqlite3_mutex *)0x0) {
    db_00 = (sqlite3 *)*local_10;
    if ((in_EDX < 0) ||
       (((*(int *)&db_00->pVfs == in_EDX && (-1 < *(int *)((long)&db_00->pVfs + 4))) &&
        ((0x1f < *(int *)((long)&db_00->pVfs + 4) ||
         ((in_ECX & 1 << ((byte)*(undefined4 *)((long)&db_00->pVfs + 4) & 0x1f)) == 0)))))) {
      if (db_00->pDfltColl != (CollSeq *)0x0) {
        (*(code *)db_00->pDfltColl)(db_00->pVdbe);
      }
      *local_10 = db_00->mutex;
      sqlite3DbFree(db_00,in_stack_ffffffffffffffd8);
    }
    else {
      local_10 = &db_00->mutex;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeDeleteAuxData(sqlite3 *db, AuxData **pp, int iOp, int mask){
  while( *pp ){
    AuxData *pAux = *pp;
    if( (iOp<0)
     || (pAux->iAuxOp==iOp
          && pAux->iAuxArg>=0
          && (pAux->iAuxArg>31 || !(mask & MASKBIT32(pAux->iAuxArg))))
    ){
      testcase( pAux->iAuxArg==31 );
      if( pAux->xDeleteAux ){
        pAux->xDeleteAux(pAux->pAux);
      }
      *pp = pAux->pNextAux;
      sqlite3DbFree(db, pAux);
    }else{
      pp= &pAux->pNextAux;
    }
  }
}